

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_ref_def_cmp_for_sort(void *a,void *b)

{
  uint uVar1;
  ulong *in_RSI;
  ulong *in_RDI;
  MD_REF_DEF *b_ref;
  MD_REF_DEF *a_ref;
  int cmp;
  void *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = md_ref_def_cmp((void *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffe8),
                         in_stack_ffffffffffffffe0);
  if (uVar1 == 0) {
    if (*in_RDI < *in_RSI) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = (uint)(*in_RSI < *in_RDI);
    }
  }
  return uVar1;
}

Assistant:

static int
md_ref_def_cmp_for_sort(const void* a, const void* b)
{
    int cmp;

    cmp = md_ref_def_cmp(a, b);

    /* Ensure stability of the sorting. */
    if(cmp == 0) {
        const MD_REF_DEF* a_ref = *(const MD_REF_DEF**)a;
        const MD_REF_DEF* b_ref = *(const MD_REF_DEF**)b;

        if(a_ref < b_ref)
            cmp = -1;
        else if(a_ref > b_ref)
            cmp = +1;
        else
            cmp = 0;
    }

    return cmp;
}